

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_>::ComputeCurrentValue
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<ParamIterator<DescriptorPoolMode>,_ParamIterator<const_char_*>_>_>
  *this_00;
  char **__args_1;
  __tuple_element_t<1UL,_tuple<ParamIterator<DescriptorPoolMode>,_ParamIterator<const_char_*>_>_>
  *this_01;
  shared_ptr<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
  local_20;
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *local_10;
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this_local;
  
  local_10 = this;
  bVar1 = AtEnd(this);
  if (!bVar1) {
    this_00 = std::
              get<0ul,testing::internal::ParamIterator<google::protobuf::descriptor_unittest::DescriptorPoolMode>,testing::internal::ParamIterator<char_const*>>
                        (&this->current_);
    __args_1 = (char **)ParamIterator<google::protobuf::descriptor_unittest::DescriptorPoolMode>::
                        operator*(this_00);
    this_01 = std::
              get<1ul,testing::internal::ParamIterator<google::protobuf::descriptor_unittest::DescriptorPoolMode>,testing::internal::ParamIterator<char_const*>>
                        (&this->current_);
    ParamIterator<const_char_*>::operator*(this_01);
    std::
    make_shared<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,char_const*>,google::protobuf::descriptor_unittest::DescriptorPoolMode_const&,char_const*const&>
              ((DescriptorPoolMode *)&local_20,__args_1);
    std::
    shared_ptr<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
    ::operator=(&this->current_value_,&local_20);
    std::
    shared_ptr<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
    ::~shared_ptr(&local_20);
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }